

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void P_LineOpening_XFloors
               (FLineOpening *open,AActor *thing,line_t *linedef,double x,double y,bool restrict)

{
  F3DFloor *pFVar1;
  uint uVar2;
  F3DFloor **ppFVar3;
  double dVar4;
  double b;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  sector_t *local_f0;
  sector_t *local_e8;
  double delta2;
  double delta1;
  double ff_top;
  double ff_bottom;
  F3DFloor *rover;
  uint i;
  int j;
  secplane_t *highestfloorplanes [2];
  sector_t *highestfloorsec;
  sector_t *lowestceilingsec;
  int local_80;
  FTextureID lowestceilingpic;
  int highestfloorterrain;
  FTextureID highestfloorpic;
  double lowestfloor [2];
  double highestfloor;
  double lowestceiling;
  xfloor *xf [2];
  double thingtop;
  double thingbot;
  bool restrict_local;
  double y_local;
  double x_local;
  line_t *linedef_local;
  AActor *thing_local;
  FLineOpening *open_local;
  
  if (thing != (AActor *)0x0) {
    dVar4 = AActor::Z(thing);
    xf[1] = (xfloor *)AActor::Top(thing);
    xf[0] = &linedef->backsector->e->XFloor;
    uVar2 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&linedef->frontsector->e->XFloor);
    if ((uVar2 != 0) ||
       (uVar2 = TArray<F3DFloor_*,_F3DFloor_*>::Size((TArray<F3DFloor_*,_F3DFloor_*> *)xf[0]),
       uVar2 != 0)) {
      highestfloor = open->top;
      lowestfloor[1] = open->bottom;
      _highestfloorterrain = secplane_t::ZatPoint(&linedef->frontsector->floorplane,x,y);
      b = secplane_t::ZatPoint(&linedef->backsector->floorplane,x,y);
      FTextureID::FTextureID(&lowestceilingpic);
      local_80 = -1;
      FTextureID::FTextureID((FTextureID *)((long)&lowestceilingsec + 4));
      highestfloorsec = (sector_t *)0x0;
      highestfloorplanes[1] = (secplane_t *)0x0;
      memset(&i,0,0x10);
      FTextureID::SetInvalid(&lowestceilingpic);
      FTextureID::SetInvalid((FTextureID *)((long)&lowestceilingsec + 4));
      for (rover._4_4_ = 0; rover._4_4_ < 2; rover._4_4_ = rover._4_4_ + 1) {
        for (rover._0_4_ = 0;
            uVar2 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)xf[(long)rover._4_4_ + -1]),
            (uint)rover < uVar2; rover._0_4_ = (uint)rover + 1) {
          ppFVar3 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)xf[(long)rover._4_4_ + -1],
                               (ulong)(uint)rover);
          pFVar1 = *ppFVar3;
          if (((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 2) != 0)) {
            dVar5 = secplane_t::ZatPoint((pFVar1->bottom).plane,x,y);
            dVar6 = secplane_t::ZatPoint((pFVar1->top).plane,x,y);
            dVar7 = ABS(dVar4 - (dVar5 + dVar6) / 2.0);
            dVar8 = ABS((double)xf[1] - (dVar5 + dVar6) / 2.0);
            if ((dVar5 < highestfloor) && (dVar8 < dVar7)) {
              lowestceilingsec._4_4_ = ((pFVar1->bottom).texture)->texnum;
              if (rover._4_4_ == 0) {
                local_e8 = linedef->frontsector;
              }
              else {
                local_e8 = linedef->backsector;
              }
              highestfloorsec = local_e8;
              highestfloor = dVar5;
            }
            if (((lowestfloor[1] < dVar6) && (dVar7 <= dVar8)) &&
               ((!restrict || (dVar5 = AActor::Z(thing), dVar6 <= dVar5)))) {
              lowestceilingpic.texnum = ((pFVar1->top).texture)->texnum;
              local_80 = sector_t::GetTerrain(pFVar1->model,(pFVar1->top).isceiling);
              if (rover._4_4_ == 0) {
                local_f0 = linedef->frontsector;
              }
              else {
                local_f0 = linedef->backsector;
              }
              highestfloorplanes[1] = (secplane_t *)local_f0;
              *(secplane_t **)(&i + (long)rover._4_4_ * 2) = (pFVar1->top).plane;
              lowestfloor[1] = dVar6;
            }
            if ((*(double *)(&highestfloorterrain + (long)rover._4_4_ * 2) <= dVar6 &&
                 dVar6 != *(double *)(&highestfloorterrain + (long)rover._4_4_ * 2)) &&
               (dVar5 = AActor::Z(thing), dVar6 <= dVar5 + thing->MaxStepHeight)) {
              *(double *)(&highestfloorterrain + (long)rover._4_4_ * 2) = dVar6;
            }
          }
        }
      }
      if (open->bottom <= lowestfloor[1] && lowestfloor[1] != open->bottom) {
        open->bottom = lowestfloor[1];
        (open->floorpic).texnum = lowestceilingpic.texnum;
        open->floorterrain = local_80;
        open->bottomsec = (sector_t *)highestfloorplanes[1];
        if (_i != (secplane_t *)0x0) {
          secplane_t::operator=(&open->frontfloorplane,_i);
          dVar4 = secplane_t::fC(&open->frontfloorplane);
          if (dVar4 < 0.0) {
            secplane_t::FlipVert(&open->frontfloorplane);
          }
        }
        if (highestfloorplanes[0] != (secplane_t *)0x0) {
          secplane_t::operator=(&open->backfloorplane,highestfloorplanes[0]);
          dVar4 = secplane_t::fC(&open->backfloorplane);
          if (dVar4 < 0.0) {
            secplane_t::FlipVert(&open->backfloorplane);
          }
        }
      }
      if (highestfloor < open->top) {
        open->top = highestfloor;
        (open->ceilingpic).texnum = lowestceilingsec._4_4_;
        open->topsec = highestfloorsec;
      }
      dVar4 = MIN<double>(_highestfloorterrain,b);
      open->lowfloor = dVar4;
    }
  }
  return;
}

Assistant:

void P_LineOpening_XFloors (FLineOpening &open, AActor * thing, const line_t *linedef, 
	double x, double y, bool restrict)
{
    if(thing)
    {
		double thingbot, thingtop;
		
		thingbot = thing->Z();
		thingtop = thing->Top();
		

		extsector_t::xfloor *xf[2] = {&linedef->frontsector->e->XFloor, &linedef->backsector->e->XFloor};

		// Check for 3D-floors in the sector (mostly identical to what Legacy does here)
		if(xf[0]->ffloors.Size() || xf[1]->ffloors.Size())
		{
			double    lowestceiling = open.top;
			double    highestfloor = open.bottom;
			double    lowestfloor[2] = {
				linedef->frontsector->floorplane.ZatPoint(x, y), 
				linedef->backsector->floorplane.ZatPoint(x, y) };
			FTextureID highestfloorpic;
			int highestfloorterrain = -1;
			FTextureID lowestceilingpic;
			sector_t *lowestceilingsec = NULL, *highestfloorsec = NULL;
			secplane_t *highestfloorplanes[2] = { NULL, NULL };
			
			highestfloorpic.SetInvalid();
			lowestceilingpic.SetInvalid();
			
			for(int j=0;j<2;j++)
			{
				for(unsigned i=0;i<xf[j]->ffloors.Size();i++)
				{
					F3DFloor *rover = xf[j]->ffloors[i];

					if (!(rover->flags & FF_EXISTS)) continue;
					if (!(rover->flags & FF_SOLID)) continue;
					
					double ff_bottom=rover->bottom.plane->ZatPoint(x, y);
					double ff_top=rover->top.plane->ZatPoint(x, y);
					
					double delta1 = fabs(thingbot - ((ff_bottom + ff_top) / 2));
					double delta2 = fabs(thingtop - ((ff_bottom + ff_top) / 2));
					
					if(ff_bottom < lowestceiling && delta1 > delta2) 
					{
						lowestceiling = ff_bottom;
						lowestceilingpic = *rover->bottom.texture;
						lowestceilingsec = j == 0 ? linedef->frontsector : linedef->backsector;
					}
					
					if(ff_top > highestfloor && delta1 <= delta2 && (!restrict || thing->Z() >= ff_top))
					{
						highestfloor = ff_top;
						highestfloorpic = *rover->top.texture;
						highestfloorterrain = rover->model->GetTerrain(rover->top.isceiling);
						highestfloorsec = j == 0 ? linedef->frontsector : linedef->backsector;
						highestfloorplanes[j] = rover->top.plane;
					}
					if(ff_top > lowestfloor[j] && ff_top <= thing->Z() + thing->MaxStepHeight) lowestfloor[j] = ff_top;
				}
			}
			
			if(highestfloor > open.bottom)
			{
				open.bottom = highestfloor;
				open.floorpic = highestfloorpic;
				open.floorterrain = highestfloorterrain;
				open.bottomsec = highestfloorsec;
				if (highestfloorplanes[0])
				{
					open.frontfloorplane = *highestfloorplanes[0];
					if (open.frontfloorplane.fC() < 0) open.frontfloorplane.FlipVert();
				}
				if (highestfloorplanes[1])
				{
					open.backfloorplane = *highestfloorplanes[1];
					if (open.backfloorplane.fC() < 0) open.backfloorplane.FlipVert();
				}
			}
			
			if(lowestceiling < open.top) 
			{
				open.top = lowestceiling;
				open.ceilingpic = lowestceilingpic;
				open.topsec = lowestceilingsec;
			}
			
			open.lowfloor = MIN(lowestfloor[0], lowestfloor[1]);
		}
    }
}